

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_bool j2k_set_decode_area(opj_j2k_v2_t *p_j2k,opj_image_t *p_image,OPJ_INT32 p_start_x,
                            OPJ_INT32 p_start_y,OPJ_INT32 p_end_x,OPJ_INT32 p_end_y,
                            opj_event_mgr *p_manager)

{
  byte *pbVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  opj_image_t *poVar4;
  bool bVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  undefined8 in_RAX;
  byte bVar8;
  ulong uVar9;
  char *pcVar10;
  opj_image_comp_t *poVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  opj_bool oVar15;
  undefined4 uVar16;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state != 8) {
    opj_event_msg_v2(p_manager,1,
                     "Need to decode the main header before begin to decode the remaining codestream"
                    );
    return 0;
  }
  uVar9 = (ulong)(uint)p_start_x;
  if (((p_start_y == 0 && p_start_x == 0) && p_end_x == 0) && p_end_y == 0) {
    opj_event_msg_v2(p_manager,4,
                     "No decoded area parameters, set the decoded area to the whole image\n");
    *(undefined8 *)((long)&p_j2k->m_specific_param + 0x20) = 0;
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = *(OPJ_BYTE **)&(p_j2k->m_cp).tw;
LAB_001282f2:
    oVar15 = 1;
  }
  else {
    poVar4 = p_j2k->m_private_image;
    if (poVar4->x1 < (uint)p_start_x) {
      pcVar10 = 
      "Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n";
    }
    else {
      if ((uint)p_start_x < poVar4->x0) {
        opj_event_msg_v2(p_manager,2,
                         "Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n"
                        );
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x = 0;
        p_start_x = poVar4->x0;
      }
      else {
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x =
             (p_start_x - (p_j2k->m_cp).tx0) / (p_j2k->m_cp).tdx;
      }
      p_image->x0 = p_start_x;
      if (poVar4->y1 < (uint)p_start_y) {
        pcVar10 = 
        "Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n";
        uVar9 = (ulong)(uint)p_start_y;
      }
      else {
        if ((uint)p_start_y < poVar4->y0) {
          opj_event_msg_v2(p_manager,2,
                           "Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n"
                           ,(ulong)(uint)p_start_y);
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y = 0;
          p_start_y = poVar4->y0;
        }
        else {
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y =
               (p_start_y - (p_j2k->m_cp).ty0) / (p_j2k->m_cp).tdy;
        }
        p_image->y0 = p_start_y;
        if ((uint)p_end_x < poVar4->x0) {
          pcVar10 = 
          "Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n"
          ;
          uVar9 = (ulong)(uint)p_end_x;
        }
        else {
          if (poVar4->x1 < (uint)p_end_x) {
            opj_event_msg_v2(p_manager,2,
                             "Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n"
                             ,(ulong)(uint)p_end_x);
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x = (p_j2k->m_cp).tw;
            p_end_x = poVar4->x1;
          }
          else {
            OVar2 = (p_j2k->m_cp).tdx;
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x =
                 (int)(~(p_j2k->m_cp).tx0 + p_end_x + OVar2) / (int)OVar2;
          }
          p_image->x1 = p_end_x;
          if (poVar4->y0 <= (uint)p_end_y) {
            if (poVar4->y1 < (uint)p_end_y) {
              opj_event_msg_v2(p_manager,2,
                               "Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n"
                               ,(ulong)(uint)p_end_y);
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y = (p_j2k->m_cp).th;
              p_end_y = poVar4->y1;
            }
            else {
              OVar2 = (p_j2k->m_cp).tdy;
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y =
                   (int)(~(p_j2k->m_cp).ty0 + p_end_y + OVar2) / (int)OVar2;
            }
            uVar16 = (undefined4)((ulong)in_RAX >> 0x20);
            p_image->y1 = p_end_y;
            pbVar1 = (byte *)((long)&p_j2k->m_specific_param + 0x54);
            *pbVar1 = *pbVar1 | 2;
            if (p_image->numcomps != 0) {
              poVar11 = p_image->comps;
              uVar12 = 0;
              do {
                OVar2 = poVar11->dx;
                OVar3 = poVar11->dy;
                OVar6 = (int)(p_image->x0 + (OVar2 - 1)) / (int)OVar2;
                poVar11->x0 = OVar6;
                OVar7 = (int)(p_image->y0 + OVar3 + -1) / (int)OVar3;
                poVar11->y0 = OVar7;
                bVar8 = (byte)poVar11->factor;
                iVar14 = 1 << (bVar8 & 0x1f);
                uVar13 = (iVar14 + (int)((OVar2 - 1) + p_image->x1) / (int)OVar2 + -1 >>
                         (bVar8 & 0x1f)) - ((int)(iVar14 + OVar6 + -1) >> (bVar8 & 0x1f));
                if ((int)uVar13 < 0) {
                  pcVar10 = "Size x of the decoded component image is incorrect (comp[%d].w=%d).\n";
LAB_00128575:
                  bVar5 = false;
                  opj_event_msg_v2(p_manager,1,pcVar10,(ulong)uVar12,(ulong)uVar13);
                }
                else {
                  OVar2 = p_image->y1;
                  poVar11->w = uVar13;
                  uVar13 = ((int)(OVar2 + OVar3 + -1) / (int)OVar3 + iVar14 + -1 >> (bVar8 & 0x1f))
                           - ((int)(iVar14 + OVar7 + -1) >> (bVar8 & 0x1f));
                  if ((int)uVar13 < 0) {
                    pcVar10 = 
                    "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n";
                    goto LAB_00128575;
                  }
                  poVar11->h = uVar13;
                  poVar11 = poVar11 + 1;
                  bVar5 = true;
                }
                uVar16 = (undefined4)((ulong)in_RAX >> 0x20);
                if (!bVar5) {
                  return 0;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < p_image->numcomps);
            }
            opj_event_msg_v2(p_manager,4,"Setting decoding area to %d,%d,%d,%d\n",(ulong)p_image->x0
                             ,(ulong)p_image->y0,(ulong)p_image->x1,CONCAT44(uVar16,p_image->y1));
            goto LAB_001282f2;
          }
          pcVar10 = 
          "Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n"
          ;
          uVar9 = (ulong)(uint)p_end_y;
        }
      }
    }
    oVar15 = 0;
    opj_event_msg_v2(p_manager,1,pcVar10,uVar9);
  }
  return oVar15;
}

Assistant:

opj_bool j2k_set_decode_area(	opj_j2k_v2_t *p_j2k,
								opj_image_t* p_image,
								OPJ_INT32 p_start_x, OPJ_INT32 p_start_y,
								OPJ_INT32 p_end_x, OPJ_INT32 p_end_y,
								struct opj_event_mgr * p_manager )
{
	opj_cp_v2_t * l_cp = &(p_j2k->m_cp);
	opj_image_t * l_image = p_j2k->m_private_image;

	OPJ_UINT32 it_comp;
	OPJ_INT32 l_comp_x1, l_comp_y1;
	opj_image_comp_t* l_img_comp = NULL;

	/* Check if we are read the main header */
	if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT) { /* FIXME J2K_DEC_STATE_TPHSOT)*/
		opj_event_msg_v2(p_manager, EVT_ERROR, "Need to decode the main header before begin to decode the remaining codestream");
		return OPJ_FALSE;
	}

	if ( !p_start_x && !p_start_y && !p_end_x && !p_end_y){
		opj_event_msg_v2(p_manager, EVT_INFO, "No decoded area parameters, set the decoded area to the whole image\n");

		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;

		return OPJ_TRUE;
	}

	/* ----- */
	/* Check if the positions provided by the user are correct */

	/* Left */
	if (p_start_x > l_image->x1 ) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n",
			p_start_x, l_image->x1);
		return OPJ_FALSE;
	}
	else if (p_start_x < l_image->x0){
		opj_event_msg_v2(p_manager, EVT_WARNING,
				"Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n",
				p_start_x, l_image->x0);
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_image->x0 = l_image->x0;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = (p_start_x - l_cp->tx0) / l_cp->tdx;
		p_image->x0 = p_start_x;
	}

	/* Up */
	if (p_start_y > l_image->y1){
		opj_event_msg_v2(p_manager, EVT_ERROR,
				"Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n",
				p_start_y, l_image->y1);
		return OPJ_FALSE;
	}
	else if (p_start_y < l_image->y0){
		opj_event_msg_v2(p_manager, EVT_WARNING,
				"Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n",
				p_start_y, l_image->y0);
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_image->y0 = l_image->y0;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = (p_start_y - l_cp->ty0) / l_cp->tdy;
		p_image->y0 = p_start_y;
	}

	/* Right */
	if (p_end_x < l_image->x0) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n",
			p_end_x, l_image->x0);
		return OPJ_FALSE;
	}
	else if (p_end_x > l_image->x1) {
		opj_event_msg_v2(p_manager, EVT_WARNING,
			"Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n",
			p_end_x, l_image->x1);
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_image->x1 = l_image->x1;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = int_ceildiv((p_end_x - l_cp->tx0), l_cp->tdx);
		p_image->x1 = p_end_x;
	}

	/* Bottom */
	if (p_end_y < l_image->y0) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n",
			p_end_y, l_image->y0);
		return OPJ_FALSE;
	}
	if (p_end_y > l_image->y1){
		opj_event_msg_v2(p_manager, EVT_WARNING,
			"Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n",
			p_end_y, l_image->y1);
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;
		p_image->y1 = l_image->y1;
	}
	else{
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = int_ceildiv((p_end_y - l_cp->ty0), l_cp->tdy);
		p_image->y1 = p_end_y;
	}
	/* ----- */

	p_j2k->m_specific_param.m_decoder.m_discard_tiles = 1;

	l_img_comp = p_image->comps;
	for (it_comp=0; it_comp < p_image->numcomps; ++it_comp)
	{
		OPJ_INT32 l_h,l_w;

		l_img_comp->x0 = int_ceildiv(p_image->x0, l_img_comp->dx);
		l_img_comp->y0 = int_ceildiv(p_image->y0, l_img_comp->dy);
		l_comp_x1 = int_ceildiv(p_image->x1, l_img_comp->dx);
		l_comp_y1 = int_ceildiv(p_image->y1, l_img_comp->dy);

		l_w = int_ceildivpow2(l_comp_x1, l_img_comp->factor)
				- int_ceildivpow2(l_img_comp->x0, l_img_comp->factor);
		if (l_w < 0){
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"Size x of the decoded component image is incorrect (comp[%d].w=%d).\n",
				it_comp, l_w);
			return OPJ_FALSE;
		}
		l_img_comp->w = l_w;

		l_h = int_ceildivpow2(l_comp_y1, l_img_comp->factor)
				- int_ceildivpow2(l_img_comp->y0, l_img_comp->factor);
		if (l_h < 0){
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"Size y of the decoded component image is incorrect (comp[%d].h=%d).\n",
				it_comp, l_h);
			return OPJ_FALSE;
		}
		l_img_comp->h = l_h;

		l_img_comp++;
	}

	opj_event_msg_v2( p_manager, EVT_INFO,"Setting decoding area to %d,%d,%d,%d\n",
			p_image->x0, p_image->y0, p_image->x1, p_image->y1);


	return OPJ_TRUE;
}